

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Increment_Full(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  double value;
  
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    pvVar2 = TaggedInt::Increment(aRight,scriptContext);
    return pvVar2;
  }
  bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
  if (bVar1) {
    pvVar2 = JavascriptBigInt::Increment(aRight);
    return pvVar2;
  }
  value = Increment_Helper(aRight,scriptContext);
  pvVar2 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
  return pvVar2;
}

Assistant:

Var JavascriptMath::Increment_Full(Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Increment_Full);
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::Increment(aRight, scriptContext);
            }
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Increment(aRight);
            }

            double inc = Increment_Helper(aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(inc, scriptContext);
            JIT_HELPER_END(Op_Increment_Full);
        }